

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

ScriptBuilder * __thiscall
cfd::core::ScriptBuilder::AppendElement(ScriptBuilder *this,ScriptElement *element)

{
  bool bVar1;
  iterator __first;
  iterator __last;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> __result;
  ByteData local_48;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_datas;
  ScriptElement *element_local;
  ScriptBuilder *this_local;
  
  byte_datas.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)element;
  ScriptElement::GetData(&local_48,element);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,&local_48);
  ByteData::~ByteData(&local_48);
  bVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  if (!bVar1) {
    __first = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
    __last = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
    __result = ::std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         (&this->script_byte_array_);
    ::std::
    copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )__first._M_current,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )__last._M_current,__result);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return this;
}

Assistant:

ScriptBuilder& ScriptBuilder::AppendElement(const ScriptElement& element) {
  std::vector<uint8_t> byte_datas = element.GetData().GetBytes();
  if (!byte_datas.empty()) {
    std::copy(
        byte_datas.begin(), byte_datas.end(),
        std::back_inserter(script_byte_array_));
  }
  return *this;
}